

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void Fixpp::
     visitMessage<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context,Context *visitor,StreamCursor *param_3)

{
  impl *this;
  bool bVar1;
  char cVar2;
  pair<bool,_int> pVar3;
  ulong uVar4;
  StreamCursor *cursor;
  char *errFmt;
  MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,_should_visit_unknown_tags_in_non_strict_mode::VisitRules>
  messageVisitor;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> beginString;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> msgType;
  
  this = (impl *)context->cursor;
  impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
            ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&messageVisitor.visitor,this,
             param_3);
  bVar1 = StreamCursor::advance((StreamCursor *)this,1);
  if (bVar1) {
    pVar3 = impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>((StreamCursor *)this);
    if (((ulong)pVar3 & 1) == 0) {
      bVar1 = StreamCursor::eof((StreamCursor *)this);
      if (bVar1) {
        uVar4 = 0x3f;
      }
      else {
        cVar2 = StreamCursor::current((StreamCursor *)this);
        uVar4 = (ulong)(uint)(int)cVar2;
      }
      ParsingContext::setError
                (context,ParsingError,"Could not parse BodyLength, expected int, got \'%c\'",uVar4);
      return;
    }
    bVar1 = StreamCursor::advance((StreamCursor *)this,1);
    if (bVar1) {
      impl::matchTag<Fixpp::TagT<35u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
                ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&beginString.second.second,
                 this,cursor);
      bVar1 = StreamCursor::advance((StreamCursor *)this,1);
      if (bVar1) {
        (context->version).first = (char *)beginString._0_8_;
        (context->version).second = (unsigned_long)beginString.second.first;
        context->bodyLength = pVar3.second;
        (context->msgType).first = (char *)msgType._0_8_;
        (context->msgType).second = (unsigned_long)msgType.second.first;
        messageVisitor.context = visitor;
        impl::
        visitMessage<Fixpp::impl::MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules>,should_visit_unknown_tags_in_non_strict_mode::VisitRules,Fixpp::TypedParsingContext<void>>
                  (context);
        return;
      }
      errFmt = "Expected Header after MsgType, got EOF";
    }
    else {
      errFmt = "Expected MsgType after BodyLength, got EOF";
    }
  }
  else {
    errFmt = "Expected BodyLength after BeginString, got EOFs";
  }
  ParsingContext::setError(context,Incomplete,errFmt);
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
    {
        auto& cursor = context.cursor;
        auto beginString = impl::matchTag<Tag::BeginString>(cursor);

        TRY_ADVANCE("Expected BodyLength after BeginString, got EOFs");

        auto bodyLength = impl::matchTag<Tag::BodyLength>(cursor);
        if (!bodyLength.first)
        {
            context.setError(ErrorKind::ParsingError,
                             "Could not parse BodyLength, expected int, got '%c'",
                              CURSOR_CURRENT(cursor));
            return;
        }

        TRY_ADVANCE("Expected MsgType after BodyLength, got EOF");
        auto msgType = impl::matchTag<Tag::MsgType>(cursor);
        TRY_ADVANCE("Expected Header after MsgType, got EOF");

        context.setVersion(beginString.second);
        context.setBodyLength(bodyLength.second);
        context.setMsgType(msgType.second);

        impl::MessageVisitor<Visitor, Rules> messageVisitor(context, visitor);
        impl::visitMessage(context, messageVisitor, rules);
    }